

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_edge_lock.hpp
# Opt level: O0

tuple<double,_double,_double> * __thiscall
ear::ScreenEdgeLockHandler::handleVector
          (tuple<double,_double,_double> *__return_storage_ptr__,ScreenEdgeLockHandler *this,
          Vector3d *pos,ScreenEdgeLock *screenEdgeLock)

{
  bool bVar1;
  not_implemented *this_00;
  Scalar *__args;
  Scalar *__args_1;
  Scalar *__args_2;
  allocator<char> local_59;
  string local_58;
  ScreenEdgeLock *local_38;
  ScreenEdgeLock *screenEdgeLock_local;
  Vector3d *pos_local;
  ScreenEdgeLockHandler *this_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  ScreenEdgeLock *local_10;
  
  local_38 = screenEdgeLock;
  screenEdgeLock_local = (ScreenEdgeLock *)pos;
  pos_local = (Vector3d *)this;
  this_local = (ScreenEdgeLockHandler *)__return_storage_ptr__;
  local_10 = screenEdgeLock;
  bVar1 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!(&screenEdgeLock->horizontal);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_18 = &screenEdgeLock->vertical;
    bVar1 = boost::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!(local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __args = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)pos,0);
      __args_1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)pos,1);
      __args_2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)pos,2);
      std::make_tuple<double&,double&,double&>(__return_storage_ptr__,__args,__args_1,__args_2);
      return __return_storage_ptr__;
    }
  }
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"screenEdgeLock",&local_59)
  ;
  not_implemented::not_implemented(this_00,&local_58);
  __cxa_throw(this_00,&not_implemented::typeinfo,not_implemented::~not_implemented);
}

Assistant:

std::tuple<double, double, double> handleVector(
        Eigen::Vector3d pos, ScreenEdgeLock screenEdgeLock) {
      if (screenEdgeLock.horizontal || screenEdgeLock.vertical)
        throw not_implemented("screenEdgeLock");

      return std::make_tuple(pos(0), pos(1), pos(2));
    }